

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
::parse_flags(basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
              *this,format_specs *spec,iterator *it)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte *pbVar4;
  byte bVar5;
  
  pbVar2 = (byte *)it->end_;
  bVar3 = (spec->super_core_format_specs).flags;
  pbVar4 = (byte *)it->ptr_;
  do {
    while( true ) {
      pbVar1 = pbVar4 + 1;
      it->ptr_ = (char *)pbVar1;
      if (pbVar4 == pbVar2) {
        bVar5 = 0;
      }
      else {
        bVar5 = *pbVar4;
      }
      if (bVar5 < 0x2d) break;
      if (bVar5 == 0x30) {
        (spec->super_align_spec).fill_ = L'0';
        pbVar4 = pbVar1;
      }
      else {
        if (bVar5 != 0x2d) goto LAB_001347d1;
        (spec->super_align_spec).align_ = ALIGN_LEFT;
        pbVar4 = pbVar1;
      }
    }
    if (bVar5 == 0x20) {
      bVar3 = bVar3 | 1;
    }
    else if (bVar5 == 0x23) {
      bVar3 = bVar3 | 8;
    }
    else {
      if (bVar5 != 0x2b) {
LAB_001347d1:
        it->ptr_ = (char *)pbVar4;
        return;
      }
      bVar3 = bVar3 | 3;
    }
    (spec->super_core_format_specs).flags = bVar3;
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

void basic_printf_context<OutputIt, Char, AF>::parse_flags(
    format_specs &spec, iterator &it) {
  for (;;) {
    switch (*it++) {
      case '-':
        spec.align_ = ALIGN_LEFT;
        break;
      case '+':
        spec.flags |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '0':
        spec.fill_ = '0';
        break;
      case ' ':
        spec.flags |= SIGN_FLAG;
        break;
      case '#':
        spec.flags |= HASH_FLAG;
        break;
      default:
        --it;
        return;
    }
  }
}